

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

int lws_system_blob_get(lws_system_blob_t *b,uint8_t *buf,size_t *len,size_t ofs)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  if (b->is_direct == '\0') {
    uVar2 = lws_buflist_linear_copy((lws_buflist **)b,ofs,buf,*len);
    if ((int)uVar2 < 0) {
      return -2;
    }
    *len = (ulong)uVar2;
  }
  else {
    if ((b->u).bl == (lws_buflist *)0x0) {
      __assert_fail("b->u.direct.ptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/system/system.c"
                    ,0x53,
                    "int lws_system_blob_get(lws_system_blob_t *, uint8_t *, size_t *, size_t)");
    }
    uVar1 = (b->u).direct.len;
    uVar3 = uVar1 - ofs;
    if (uVar1 < ofs || uVar3 == 0) {
      *len = 0;
      return 1;
    }
    if (uVar3 < *len) {
      *len = uVar3;
    }
    memcpy(buf,(void *)((long)&((b->u).bl)->next + ofs),*len);
  }
  return 0;
}

Assistant:

int
lws_system_blob_get(lws_system_blob_t *b, uint8_t *buf, size_t *len, size_t ofs)
{
	int n;

	if (b->is_direct) {

		assert(b->u.direct.ptr);

		if (ofs >= b->u.direct.len) {
			*len = 0;
			return 1;
		}

		if (*len > b->u.direct.len - ofs)
			*len = b->u.direct.len - ofs;

		memcpy(buf, b->u.direct.ptr + ofs, *len);

		return 0;
	}

	n = lws_buflist_linear_copy(&b->u.bl, ofs, buf, *len);
	if (n < 0)
		return -2;

	*len = n;

	return 0;
}